

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memcpy.c
# Opt level: O2

void * memcpy(void *__dest,void *__src,size_t __n)

{
  size_t sVar1;
  char *src;
  char *dest;
  
  for (sVar1 = 0; __n != sVar1; sVar1 = sVar1 + 1) {
    *(undefined1 *)((long)__dest + sVar1) = *(undefined1 *)((long)__src + sVar1);
  }
  return __dest;
}

Assistant:

void * memcpy( void * _PDCLIB_restrict s1, const void * _PDCLIB_restrict s2, size_t n )
{
    char * dest = ( char * ) s1;
    const char * src = ( const char * ) s2;

    while ( n-- )
    {
        *dest++ = *src++;
    }

    return s1;
}